

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O1

element * __thiscall MinVR::element::add_child_element(element *this)

{
  size_t *psVar1;
  element *this_00;
  _List_node_base *p_Var2;
  
  this_00 = (element *)operator_new(0xb0);
  element(this_00);
  this_00->m_parent = this;
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  psVar1 = &(this->m_element_list).
            super__List_base<MinVR::element_*,_std::allocator<MinVR::element_*>_>._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 + 1;
  p_Var2 = (this->m_element_list).
           super__List_base<MinVR::element_*,_std::allocator<MinVR::element_*>_>._M_impl._M_node.
           super__List_node_base._M_prev;
  (this->m_element_iterator)._M_node =
       (this->m_element_list).super__List_base<MinVR::element_*,_std::allocator<MinVR::element_*>_>.
       _M_impl._M_node.super__List_node_base._M_next;
  (this->i)._M_node = p_Var2;
  return (element *)p_Var2[1]._M_next;
}

Assistant:

element* element::add_child_element()
{
    element* child = new element();
    child->set_parent(this);
    m_element_list.push_back(child);
    i = m_element_list.end();
    m_element_iterator = m_element_list.begin();
    return (*(--i));
}